

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseRefKind(WastParser *this,Type *out_type)

{
  char cVar1;
  TokenType TVar2;
  Result RVar3;
  char *format;
  long lVar4;
  Type type;
  Token token;
  anon_union_24_4_98baf137_for_Token_2 local_98;
  undefined1 local_80 [32];
  size_type *local_60;
  anon_union_24_4_98baf137_for_Token_2 local_58;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  TVar2 = Peek(this,0);
  if (2 < TVar2 - First_RefKind) {
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"func","");
    local_60 = &local_58.text_.size_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"extern","");
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"exn","");
    local_98.text_.data_ = (char *)0x0;
    local_98.text_.size_ = 0;
    local_98.literal_.text.size_ = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_98,
               (string *)local_80,&stack0xffffffffffffffe0);
    lVar4 = 0;
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_98.text_,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_98.text_);
    do {
      if (local_30 + lVar4 != *(undefined1 **)((long)local_40 + lVar4)) {
        operator_delete(*(undefined1 **)((long)local_40 + lVar4));
      }
      lVar4 = lVar4 + -0x20;
    } while (lVar4 != -0x60);
    return (Result)RVar3.enum_;
  }
  Consume((Token *)local_80,this);
  if (3 < (TokenType)local_60 - First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                  ,0x67,"Type wabt::Token::type() const");
  }
  local_98.literal_.type = local_58.literal_.type;
  if (local_58.literal_.type + 0x22 < 2) {
    cVar1 = (this->options_->features).gc_enabled_;
  }
  else {
    if (local_58.literal_.type != 0xffffffef) goto LAB_00166dbb;
    cVar1 = (this->options_->features).reference_types_enabled_;
  }
  if (cVar1 == '\0') {
    format = Type::GetName(&local_98.type_);
    Error(this,0x19b098,format);
    return (Result)Error;
  }
LAB_00166dbb:
  out_type->enum_ = (Enum)local_58.type_.enum_;
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseRefKind(Type* out_type) {
  WABT_TRACE(ParseRefKind);
  if (!IsTokenTypeRefKind(Peek())) {
    return ErrorExpected({"func", "extern", "exn"});
  }

  Token token = Consume();
  Type type = token.type();

  if ((type == Type::ExternRef &&
       !options_->features.reference_types_enabled()) ||
      ((type == Type::Struct || type == Type::Array) &&
       !options_->features.gc_enabled())) {
    Error(token.loc, "value type not allowed: %s", type.GetName());
    return Result::Error;
  }

  *out_type = type;
  return Result::Ok;
}